

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  FileOptions *pFVar1;
  FileDescriptorProto *pFVar2;
  SourceCodeInfo *pSVar3;
  MessageOptions *pMVar4;
  DescriptorProto *pDVar5;
  FieldOptions *pFVar6;
  FieldDescriptorProto *pFVar7;
  OneofOptions *pOVar8;
  OneofDescriptorProto *pOVar9;
  EnumOptions *pEVar10;
  EnumDescriptorProto *pEVar11;
  EnumValueOptions *pEVar12;
  EnumValueDescriptorProto *pEVar13;
  ServiceOptions *pSVar14;
  ServiceDescriptorProto *pSVar15;
  MethodOptions *pMVar16;
  MethodDescriptorProto *pMVar17;
  
  internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
            );
  internal::InitProtobufDefaults();
  internal::ExplicitlyConstructed<google::protobuf::FileDescriptorSet>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::FileDescriptorSet> *)
             _FileDescriptorSet_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::FileDescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::FileDescriptorProto> *)
             _FileDescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::DescriptorProto_ExtensionRange>::
  DefaultConstruct((ExplicitlyConstructed<google::protobuf::DescriptorProto_ExtensionRange> *)
                   _DescriptorProto_ExtensionRange_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::DescriptorProto_ReservedRange>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::DescriptorProto_ReservedRange> *)
             _DescriptorProto_ReservedRange_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::DescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::DescriptorProto> *)
             _DescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::FieldDescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::FieldDescriptorProto> *)
             _FieldDescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::OneofDescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::OneofDescriptorProto> *)
             _OneofDescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::EnumDescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::EnumDescriptorProto> *)
             _EnumDescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::EnumValueDescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::EnumValueDescriptorProto> *)
             _EnumValueDescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::ServiceDescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::ServiceDescriptorProto> *)
             _ServiceDescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::MethodDescriptorProto>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::MethodDescriptorProto> *)
             _MethodDescriptorProto_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::FileOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::FileOptions> *)_FileOptions_default_instance_)
  ;
  internal::ExplicitlyConstructed<google::protobuf::MessageOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::MessageOptions> *)
             _MessageOptions_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::FieldOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::FieldOptions> *)
             _FieldOptions_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::OneofOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::OneofOptions> *)
             _OneofOptions_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::EnumOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::EnumOptions> *)_EnumOptions_default_instance_)
  ;
  internal::ExplicitlyConstructed<google::protobuf::EnumValueOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::EnumValueOptions> *)
             _EnumValueOptions_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::ServiceOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::ServiceOptions> *)
             _ServiceOptions_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::MethodOptions>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::MethodOptions> *)
             _MethodOptions_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::UninterpretedOption_NamePart>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::UninterpretedOption_NamePart> *)
             _UninterpretedOption_NamePart_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::UninterpretedOption>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::UninterpretedOption> *)
             _UninterpretedOption_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::SourceCodeInfo_Location>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::SourceCodeInfo_Location> *)
             _SourceCodeInfo_Location_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::SourceCodeInfo>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::SourceCodeInfo> *)
             _SourceCodeInfo_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo_Annotation>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo_Annotation> *)
             _GeneratedCodeInfo_Annotation_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo> *)
             _GeneratedCodeInfo_default_instance_);
  pFVar1 = FileOptions::internal_default_instance();
  pFVar2 = internal::ExplicitlyConstructed<google::protobuf::FileDescriptorProto>::get_mutable
                     ((ExplicitlyConstructed<google::protobuf::FileDescriptorProto> *)
                      _FileDescriptorProto_default_instance_);
  pFVar2->options_ = pFVar1;
  pSVar3 = SourceCodeInfo::internal_default_instance();
  pFVar2 = internal::ExplicitlyConstructed<google::protobuf::FileDescriptorProto>::get_mutable
                     ((ExplicitlyConstructed<google::protobuf::FileDescriptorProto> *)
                      _FileDescriptorProto_default_instance_);
  pFVar2->source_code_info_ = pSVar3;
  pMVar4 = MessageOptions::internal_default_instance();
  pDVar5 = internal::ExplicitlyConstructed<google::protobuf::DescriptorProto>::get_mutable
                     ((ExplicitlyConstructed<google::protobuf::DescriptorProto> *)
                      _DescriptorProto_default_instance_);
  pDVar5->options_ = pMVar4;
  pFVar6 = FieldOptions::internal_default_instance();
  pFVar7 = internal::ExplicitlyConstructed<google::protobuf::FieldDescriptorProto>::get_mutable
                     ((ExplicitlyConstructed<google::protobuf::FieldDescriptorProto> *)
                      _FieldDescriptorProto_default_instance_);
  pFVar7->options_ = pFVar6;
  pOVar8 = OneofOptions::internal_default_instance();
  pOVar9 = internal::ExplicitlyConstructed<google::protobuf::OneofDescriptorProto>::get_mutable
                     ((ExplicitlyConstructed<google::protobuf::OneofDescriptorProto> *)
                      _OneofDescriptorProto_default_instance_);
  pOVar9->options_ = pOVar8;
  pEVar10 = EnumOptions::internal_default_instance();
  pEVar11 = internal::ExplicitlyConstructed<google::protobuf::EnumDescriptorProto>::get_mutable
                      ((ExplicitlyConstructed<google::protobuf::EnumDescriptorProto> *)
                       _EnumDescriptorProto_default_instance_);
  pEVar11->options_ = pEVar10;
  pEVar12 = EnumValueOptions::internal_default_instance();
  pEVar13 = internal::ExplicitlyConstructed<google::protobuf::EnumValueDescriptorProto>::get_mutable
                      ((ExplicitlyConstructed<google::protobuf::EnumValueDescriptorProto> *)
                       _EnumValueDescriptorProto_default_instance_);
  pEVar13->options_ = pEVar12;
  pSVar14 = ServiceOptions::internal_default_instance();
  pSVar15 = internal::ExplicitlyConstructed<google::protobuf::ServiceDescriptorProto>::get_mutable
                      ((ExplicitlyConstructed<google::protobuf::ServiceDescriptorProto> *)
                       _ServiceDescriptorProto_default_instance_);
  pSVar15->options_ = pSVar14;
  pMVar16 = MethodOptions::internal_default_instance();
  pMVar17 = internal::ExplicitlyConstructed<google::protobuf::MethodDescriptorProto>::get_mutable
                      ((ExplicitlyConstructed<google::protobuf::MethodDescriptorProto> *)
                       _MethodDescriptorProto_default_instance_);
  pMVar17->options_ = pMVar16;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _FileDescriptorSet_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.DefaultConstruct();
  _DescriptorProto_ExtensionRange_default_instance_.DefaultConstruct();
  _DescriptorProto_ReservedRange_default_instance_.DefaultConstruct();
  _DescriptorProto_default_instance_.DefaultConstruct();
  _FieldDescriptorProto_default_instance_.DefaultConstruct();
  _OneofDescriptorProto_default_instance_.DefaultConstruct();
  _EnumDescriptorProto_default_instance_.DefaultConstruct();
  _EnumValueDescriptorProto_default_instance_.DefaultConstruct();
  _ServiceDescriptorProto_default_instance_.DefaultConstruct();
  _MethodDescriptorProto_default_instance_.DefaultConstruct();
  _FileOptions_default_instance_.DefaultConstruct();
  _MessageOptions_default_instance_.DefaultConstruct();
  _FieldOptions_default_instance_.DefaultConstruct();
  _OneofOptions_default_instance_.DefaultConstruct();
  _EnumOptions_default_instance_.DefaultConstruct();
  _EnumValueOptions_default_instance_.DefaultConstruct();
  _ServiceOptions_default_instance_.DefaultConstruct();
  _MethodOptions_default_instance_.DefaultConstruct();
  _UninterpretedOption_NamePart_default_instance_.DefaultConstruct();
  _UninterpretedOption_default_instance_.DefaultConstruct();
  _SourceCodeInfo_Location_default_instance_.DefaultConstruct();
  _SourceCodeInfo_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_Annotation_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FileOptions*>(
      ::google::protobuf::FileOptions::internal_default_instance());
  _FileDescriptorProto_default_instance_.get_mutable()->source_code_info_ = const_cast< ::google::protobuf::SourceCodeInfo*>(
      ::google::protobuf::SourceCodeInfo::internal_default_instance());
  _DescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MessageOptions*>(
      ::google::protobuf::MessageOptions::internal_default_instance());
  _FieldDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FieldOptions*>(
      ::google::protobuf::FieldOptions::internal_default_instance());
  _OneofDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::OneofOptions*>(
      ::google::protobuf::OneofOptions::internal_default_instance());
  _EnumDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumOptions*>(
      ::google::protobuf::EnumOptions::internal_default_instance());
  _EnumValueDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumValueOptions*>(
      ::google::protobuf::EnumValueOptions::internal_default_instance());
  _ServiceDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::ServiceOptions*>(
      ::google::protobuf::ServiceOptions::internal_default_instance());
  _MethodDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MethodOptions*>(
      ::google::protobuf::MethodOptions::internal_default_instance());
}